

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckAtomicAlign
          (SharedValidator *this,Location *loc,Address alignment,Address natural_alignment)

{
  bool bVar1;
  Address natural_alignment_local;
  Address alignment_local;
  Location *loc_local;
  SharedValidator *this_local;
  
  bVar1 = is_power_of_two(alignment);
  if (bVar1) {
    if (alignment == natural_alignment) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      PrintError(this,loc,"alignment must be equal to natural alignment (%u)",
                 (ulong)natural_alignment);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,loc,"alignment (%u) must be a power of 2",(ulong)alignment);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckAtomicAlign(const Location& loc,
                                         Address alignment,
                                         Address natural_alignment) {
  if (!is_power_of_two(alignment)) {
    PrintError(loc, "alignment (%u) must be a power of 2", alignment);
    return Result::Error;
  }
  if (alignment != natural_alignment) {
    PrintError(loc, "alignment must be equal to natural alignment (%u)",
               natural_alignment);
    return Result::Error;
  }
  return Result::Ok;
}